

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
::find_or_prepare_insert_non_soo<std::pair<void_const*,void_const*>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
          *this,pair<const_void_*,_const_void_*> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  undefined1 uVar7;
  bool bVar8;
  bool bVar9;
  size_t sVar10;
  uint uVar11;
  ctrl_t *pcVar12;
  ushort uVar13;
  PolicyFunctions *in_R9;
  ulong uVar14;
  CommonFields *common;
  ulong uVar15;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  __m128i match;
  FindInfo target;
  ulong local_68;
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  
  uVar2 = *(ulong *)(this + 0x10);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar14 = ((ulong)key->first ^ 0x58dc48) * -0x234dd359734ecb13;
  uVar14 = ((uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
            uVar14 << 0x38) ^ (ulong)key->first) * -0x234dd359734ecb13;
  uVar14 = ((uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
            uVar14 << 0x38) ^ (ulong)key->second) * -0x234dd359734ecb13;
  uVar14 = ((uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
            uVar14 << 0x38) ^ (ulong)key->second) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 | (uVar14 & 0xff0000000000) >> 0x18
            | (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
            (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
  uVar15 = ((ulong)common >> 7 ^ uVar2 >> 0xc) & uVar3;
  uVar7 = (undefined1)(uVar14 >> 0x38);
  auVar17 = ZEXT216(CONCAT11(uVar7,uVar7) & 0x7f7f);
  auVar17 = pshuflw(auVar17,auVar17,0);
  pcVar12 = (__return_storage_ptr__->first).ctrl_;
  aVar16 = (__return_storage_ptr__->first).field_1;
  bVar8 = __return_storage_ptr__->second;
  local_68 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar15);
    cVar19 = auVar17[0];
    auVar20[0] = -(cVar19 == *pcVar1);
    cVar21 = auVar17[1];
    auVar20[1] = -(cVar21 == pcVar1[1]);
    cVar22 = auVar17[2];
    auVar20[2] = -(cVar22 == pcVar1[2]);
    cVar23 = auVar17[3];
    auVar20[3] = -(cVar23 == pcVar1[3]);
    auVar20[4] = -(cVar19 == pcVar1[4]);
    auVar20[5] = -(cVar21 == pcVar1[5]);
    auVar20[6] = -(cVar22 == pcVar1[6]);
    auVar20[7] = -(cVar23 == pcVar1[7]);
    auVar20[8] = -(cVar19 == pcVar1[8]);
    auVar20[9] = -(cVar21 == pcVar1[9]);
    auVar20[10] = -(cVar22 == pcVar1[10]);
    auVar20[0xb] = -(cVar23 == pcVar1[0xb]);
    auVar20[0xc] = -(cVar19 == pcVar1[0xc]);
    auVar20[0xd] = -(cVar21 == pcVar1[0xd]);
    auVar20[0xe] = -(cVar22 == pcVar1[0xe]);
    auVar20[0xf] = -(cVar23 == pcVar1[0xf]);
    uVar13 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
    uVar11 = (uint)uVar13;
    if (uVar13 != 0) {
      lVar4 = *(long *)(this + 0x18);
      in_R9 = (PolicyFunctions *)key->first;
      do {
        uVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar14 = uVar5 + uVar15 & uVar3;
        if ((*(PolicyFunctions **)(lVar4 + uVar14 * 0x18) == in_R9) &&
           (*(void **)(lVar4 + 8 + uVar14 * 0x18) == key->second)) {
          (__return_storage_ptr__->first).field_1 = aVar16;
          __return_storage_ptr__->second = bVar8;
          (__return_storage_ptr__->first).ctrl_ = pcVar12;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar14);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar4 + uVar14 * 0x18);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_002b12b8;
        }
        uVar13 = (ushort)(uVar11 - 1) & (ushort)uVar11;
        uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar13);
      } while (uVar13 != 0);
    }
    auVar18[0] = -(*pcVar1 == -0x80);
    auVar18[1] = -(pcVar1[1] == -0x80);
    auVar18[2] = -(pcVar1[2] == -0x80);
    auVar18[3] = -(pcVar1[3] == -0x80);
    auVar18[4] = -(pcVar1[4] == -0x80);
    auVar18[5] = -(pcVar1[5] == -0x80);
    auVar18[6] = -(pcVar1[6] == -0x80);
    auVar18[7] = -(pcVar1[7] == -0x80);
    auVar18[8] = -(pcVar1[8] == -0x80);
    auVar18[9] = -(pcVar1[9] == -0x80);
    auVar18[10] = -(pcVar1[10] == -0x80);
    auVar18[0xb] = -(pcVar1[0xb] == -0x80);
    auVar18[0xc] = -(pcVar1[0xc] == -0x80);
    auVar18[0xd] = -(pcVar1[0xd] == -0x80);
    auVar18[0xe] = -(pcVar1[0xe] == -0x80);
    auVar18[0xf] = -(pcVar1[0xf] == -0x80);
    uVar13 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    if (uVar13 == 0) {
      if (*(ulong *)this < local_68 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar16;
        __return_storage_ptr__->second = bVar8;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>, K = std::pair<const void *, const void *>]"
                     );
      }
      uVar15 = uVar15 + local_68 + 0x10 & uVar3;
      local_68 = local_68 + 0x10;
    }
    else {
      bVar9 = ShouldInsertBackwardsForDebug
                        (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar9) {
        uVar6 = 0xf;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar11 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar11 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_68;
      sVar10 = PrepareInsertNonSoo((container_internal *)this,common,uVar11 + uVar15 & uVar3,target,
                                   in_R9);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar16;
        __return_storage_ptr__->second = bVar8;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
LAB_002b12b8:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
                     );
      }
      pcVar12 = (ctrl_t *)(*(long *)(this + 0x10) + sVar10);
      aVar16.slot_ = (slot_type *)(sVar10 * 0x18 + *(long *)(this + 0x18));
      bVar8 = true;
    }
    if (uVar13 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar16;
      __return_storage_ptr__->second = bVar8;
      (__return_storage_ptr__->first).ctrl_ = pcVar12;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_IGNORE_UNINITIALIZED_RETURN(heap.control);
  }